

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O0

void __thiscall
proto2_unittest::TestMutualRecursionA_SubGroupR::~TestMutualRecursionA_SubGroupR
          (TestMutualRecursionA_SubGroupR *this)

{
  TestMutualRecursionA_SubGroupR *this_local;
  
  ~TestMutualRecursionA_SubGroupR(this);
  operator_delete(this,0x20);
  return;
}

Assistant:

TestMutualRecursionA_SubGroupR::~TestMutualRecursionA_SubGroupR() {
  // @@protoc_insertion_point(destructor:proto2_unittest.TestMutualRecursionA.SubGroupR)
  SharedDtor(*this);
}